

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int is_ref_frame_used_by_compound_ref(int ref_frame,int skip_ref_frame_mask)

{
  MV_REFERENCE_FRAME *rf;
  int r;
  int skip_ref_frame_mask_local;
  int ref_frame_local;
  
  r = 8;
  while( true ) {
    if (0x1c < r) {
      return 0;
    }
    if (((skip_ref_frame_mask & 1 << ((byte)r & 0x1f)) == 0) &&
       ((ref_frame_map[r + -8][0] == ref_frame || (ref_frame_map[r + -8][1] == ref_frame)))) break;
    r = r + 1;
  }
  return 1;
}

Assistant:

static inline int is_ref_frame_used_by_compound_ref(int ref_frame,
                                                    int skip_ref_frame_mask) {
  for (int r = ALTREF_FRAME + 1; r < MODE_CTX_REF_FRAMES; ++r) {
    if (!(skip_ref_frame_mask & (1 << r))) {
      const MV_REFERENCE_FRAME *rf = ref_frame_map[r - REF_FRAMES];
      if (rf[0] == ref_frame || rf[1] == ref_frame) {
        return 1;
      }
    }
  }
  return 0;
}